

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# v_font.cpp
# Opt level: O1

void __thiscall FSingleLumpFont::LoadFON2(FSingleLumpFont *this,int lump,BYTE *data)

{
  byte bVar1;
  byte bVar2;
  byte bVar3;
  ushort uVar4;
  int height;
  bool bVar5;
  size_t __n;
  int iVar6;
  CharData *pCVar7;
  void *pvVar8;
  FFontChar2 *this_00;
  int iVar9;
  uint uVar10;
  long lVar11;
  ulong uVar12;
  long lVar13;
  ushort *puVar14;
  char *pcVar15;
  uint uVar16;
  ulong uVar17;
  int iVar18;
  int local_50;
  int local_38;
  
  this->FontType = FONT2;
  (this->super_FFont).FontHeight = (uint)*(ushort *)(data + 4);
  bVar1 = data[6];
  (this->super_FFont).FirstChar = (uint)bVar1;
  bVar2 = data[7];
  (this->super_FFont).LastChar = (uint)bVar2;
  bVar3 = data[10];
  (this->super_FFont).ActiveColors = (int)((ulong)bVar3 + 1);
  (this->super_FFont).PatchRemap = (BYTE *)0x0;
  this->RescalePalette = data[9] == '\0';
  lVar11 = (ulong)bVar2 - (ulong)bVar1;
  uVar12 = (lVar11 + 1) * 0x10;
  iVar9 = (int)lVar11;
  if (iVar9 < -1) {
    uVar12 = 0xffffffffffffffff;
  }
  uVar17 = lVar11 * 4 + 4;
  if (iVar9 < -1) {
    uVar17 = 0xffffffffffffffff;
  }
  pCVar7 = (CharData *)operator_new__(uVar12);
  (this->super_FFont).Chars = pCVar7;
  pvVar8 = operator_new__(uVar17);
  if ((data[0xb] & 1) == 0) {
    lVar13 = 0xc;
    iVar6 = 0;
  }
  else {
    iVar6 = (int)*(short *)(data + 0xc);
    lVar13 = 0xe;
  }
  (this->super_FFont).GlobalKerning = iVar6;
  puVar14 = (ushort *)(data + lVar13);
  uVar16 = (uint)bVar1;
  local_50 = (int)(lVar11 + 1);
  if (data[8] == '\0') {
    if (iVar9 < 0) {
      iVar6 = 0;
      uVar12 = 0;
    }
    else {
      uVar12 = 0;
      iVar6 = 0;
      do {
        uVar4 = puVar14[uVar12];
        *(uint *)((long)pvVar8 + uVar12 * 4) = (uint)uVar4;
        iVar6 = iVar6 + (uint)uVar4;
        uVar12 = uVar12 + 1;
      } while (((uint)bVar2 - (uint)bVar1) + 1 != uVar12);
      uVar12 = uVar12 & 0xffffffff;
    }
    puVar14 = puVar14 + uVar12;
  }
  else {
    uVar4 = *puVar14;
    if (-1 < iVar9) {
      uVar12 = 0;
      do {
        *(uint *)((long)pvVar8 + uVar12 * 4) = (uint)uVar4;
        uVar12 = uVar12 + 1;
      } while ((bVar2 - uVar16) + 1 != uVar12);
    }
    iVar6 = (uint)uVar4 * local_50;
    puVar14 = puVar14 + 1;
  }
  if (bVar2 < 0x20 || 0x20 < bVar1) {
    if (bVar2 < 0x4e || 0x4e < bVar1) {
      iVar6 = (iVar6 * 2) / (local_50 * 3);
    }
    else {
      iVar6 = *(int *)((long)pvVar8 + (ulong)(0x4e - uVar16) * 4);
      iVar6 = (iVar6 - (iVar6 + 1 >> 0x1f)) + 1 >> 1;
    }
  }
  else {
    iVar6 = *(int *)((long)pvVar8 + (ulong)(0x20 - uVar16) * 4);
  }
  (this->super_FFont).SpaceWidth = iVar6;
  __n = ((ulong)bVar3 + 1) * 3;
  memcpy(this->PaletteData,puVar14,__n);
  if (-1 < iVar9) {
    pcVar15 = (char *)((long)puVar14 + __n);
    uVar16 = 0;
    do {
      lVar11 = (long)(int)uVar16;
      iVar6 = *(int *)((long)pvVar8 + lVar11 * 4);
      height = (this->super_FFont).FontHeight;
      iVar18 = height * iVar6;
      pCVar7 = (this->super_FFont).Chars;
      pCVar7[lVar11].XMove = iVar6;
      if (iVar18 < 1) {
        pCVar7[lVar11].Pic = (FTexture *)0x0;
      }
      else {
        this_00 = (FFontChar2 *)operator_new(0x78);
        local_38 = (int)data;
        FFontChar2::FFontChar2
                  (this_00,lump,(int)pcVar15 - local_38,*(int *)((long)pvVar8 + lVar11 * 4),height,0
                   ,0);
        (this->super_FFont).Chars[lVar11].Pic = (FTexture *)this_00;
        do {
          uVar10 = (uint)*pcVar15;
          if (*pcVar15 < '\0') {
            iVar18 = iVar18 + uVar10 + -1;
          }
          else {
            pcVar15 = pcVar15 + uVar10;
            iVar18 = iVar18 + ~uVar10;
          }
          pcVar15 = pcVar15 + 2;
        } while (0 < iVar18);
      }
      if (iVar18 < 0) {
        uVar16 = uVar16 + (this->super_FFont).FirstChar;
        I_FatalError("Overflow decompressing char %d (%c) of %s",(ulong)uVar16,(ulong)uVar16,
                     (this->super_FFont).Name);
      }
      bVar5 = (int)uVar16 < iVar9;
      uVar16 = uVar16 + 1;
    } while (bVar5);
  }
  (*(this->super_FFont)._vptr_FFont[4])();
  operator_delete__(pvVar8);
  return;
}

Assistant:

void FSingleLumpFont::LoadFON2 (int lump, const BYTE *data)
{
	int count, i, totalwidth;
	int *widths2;
	WORD *widths;
	const BYTE *palette;
	const BYTE *data_p;

	FontType = FONT2;
	FontHeight = data[4] + data[5]*256;
	FirstChar = data[6];
	LastChar = data[7];
	ActiveColors = data[10]+1;
	PatchRemap = NULL;
	RescalePalette = data[9] == 0;
	
	count = LastChar - FirstChar + 1;
	Chars = new CharData[count];
	widths2 = new int[count];
	if (data[11] & 1)
	{ // Font specifies a kerning value.
		GlobalKerning = LittleShort(*(SWORD *)&data[12]);
		widths = (WORD *)(data + 14);
	}
	else
	{ // Font does not specify a kerning value.
		GlobalKerning = 0;
		widths = (WORD *)(data + 12);
	}
	totalwidth = 0;

	if (data[8])
	{ // Font is mono-spaced.
		totalwidth = LittleShort(widths[0]);
		for (i = 0; i < count; ++i)
		{
			widths2[i] = totalwidth;
		}
		totalwidth *= count;
		palette = (BYTE *)&widths[1];
	}
	else
	{ // Font has varying character widths.
		for (i = 0; i < count; ++i)
		{
			widths2[i] = LittleShort(widths[i]);
			totalwidth += widths2[i];
		}
		palette = (BYTE *)(widths + i);
	}

	if (FirstChar <= ' ' && LastChar >= ' ')
	{
		SpaceWidth = widths2[' '-FirstChar];
	}
	else if (FirstChar <= 'N' && LastChar >= 'N')
	{
		SpaceWidth = (widths2['N' - FirstChar] + 1) / 2;
	}
	else
	{
		SpaceWidth = totalwidth * 2 / (3 * count);
	}

	memcpy(PaletteData, palette, ActiveColors*3);

	data_p = palette + ActiveColors*3;

	for (i = 0; i < count; ++i)
	{
		int destSize = widths2[i] * FontHeight;
		Chars[i].XMove = widths2[i];
		if (destSize <= 0)
		{
			Chars[i].Pic = NULL;
		}
		else
		{
			Chars[i].Pic = new FFontChar2 (lump, int(data_p - data), widths2[i], FontHeight);
			do
			{
				SBYTE code = *data_p++;
				if (code >= 0)
				{
					data_p += code+1;
					destSize -= code+1;
				}
				else if (code != -128)
				{
					data_p++;
					destSize -= (-code)+1;
				}
			} while (destSize > 0);
		}
		if (destSize < 0)
		{
			i += FirstChar;
			I_FatalError ("Overflow decompressing char %d (%c) of %s", i, i, Name);
		}
	}

	LoadTranslations();
	delete[] widths2;
}